

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

LightBounds * pbrt::Union(LightBounds *a,LightBounds *b)

{
  undefined8 uVar1;
  Vector3f w;
  float *pfVar2;
  void *in_RDX;
  void *in_RSI;
  LightBounds *in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar5 [64];
  DirectionCone DVar7;
  Float cosTheta_e;
  Float cosTheta_o;
  DirectionCone cone;
  DirectionCone *in_stack_000000f8;
  DirectionCone *in_stack_00000100;
  Float in_stack_ffffffffffffff4c;
  DirectionCone *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff5c;
  LightBounds *in_stack_ffffffffffffff60;
  Tuple3<pbrt::Vector3,_float> in_stack_ffffffffffffff68;
  float fVar8;
  float fVar9;
  Bounds3<float> *in_stack_ffffffffffffffd8;
  Bounds3<float> *b1;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined1 auVar4 [56];
  undefined1 auVar6 [56];
  
  if ((*(float *)((long)in_RSI + 0x18) != 0.0) || (NAN(*(float *)((long)in_RSI + 0x18)))) {
    if ((*(float *)((long)in_RDX + 0x18) != 0.0) || (NAN(*(float *)((long)in_RDX + 0x18)))) {
      DirectionCone::DirectionCone
                (in_stack_ffffffffffffff50,(Vector3f)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff4c);
      fVar9 = (float)*(undefined8 *)((long)in_RDX + 0x1c);
      auVar4 = (undefined1  [56])0x0;
      auVar6 = (undefined1  [56])0x0;
      DirectionCone::DirectionCone
                (in_stack_ffffffffffffff50,(Vector3f)in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff4c);
      DVar7 = Union(in_stack_00000100,in_stack_000000f8);
      auVar5._0_8_ = DVar7._8_8_;
      auVar5._8_56_ = auVar6;
      auVar3._0_8_ = DVar7.w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar3._8_56_ = auVar4;
      b1 = (Bounds3<float> *)vmovlpd_avx(auVar3._0_16_);
      uVar1 = vmovlpd_avx(auVar5._0_16_);
      uStack_14 = (undefined4)((ulong)uVar1 >> 0x20);
      pfVar2 = std::min<float>((float *)((long)in_RSI + 0x2c),(float *)((long)in_RDX + 0x2c));
      fVar8 = *pfVar2;
      Union<float>(b1,in_stack_ffffffffffffffd8);
      local_18 = (undefined4)uVar1;
      w.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_14;
      w.super_Tuple3<pbrt::Vector3,_float>.x = fVar8;
      w.super_Tuple3<pbrt::Vector3,_float>.z = fVar9;
      LightBounds::LightBounds
                (in_stack_ffffffffffffff60,(Bounds3f *)CONCAT44(in_stack_ffffffffffffff5c,local_18),
                 w,(Float)((ulong)b1 >> 0x20),SUB84(b1,0),in_stack_ffffffffffffff4c,
                 SUB81((ulong)uVar1 >> 0x18,0));
    }
    else {
      memcpy(in_RDI,in_RSI,0x34);
    }
  }
  else {
    memcpy(in_RDI,in_RDX,0x34);
  }
  return in_RDI;
}

Assistant:

inline LightBounds Union(const LightBounds &a, const LightBounds &b) {
    // If one _LightBounds_ has zero power, return the other
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;

    // Find average direction and updated angles for _LightBounds_
    DirectionCone cone =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float cosTheta_o = cone.cosTheta;
    Float cosTheta_e = std::min(a.cosTheta_e, b.cosTheta_e);

    // Return final _LightBounds_ union
    return LightBounds(Union(a.bounds, b.bounds), cone.w, a.phi + b.phi, cosTheta_o,
                       cosTheta_e, a.twoSided | b.twoSided);
}